

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_coder.c
# Opt level: O0

lzma_ret lzma_simple_coder_init
                   (lzma_next_coder_conflict9 *next,lzma_allocator *allocator,
                   lzma_filter_info *filters,
                   _func_size_t_lzma_simple_ptr_uint32_t__Bool_uint8_t_ptr_size_t *filter,
                   size_t simple_size,size_t unfiltered_max,uint32_t alignment,_Bool is_encoder)

{
  lzma_ret lVar1;
  lzma_coder_conflict10 *plVar2;
  lzma_simple *plVar3;
  lzma_options_bcj *simple;
  _Bool is_encoder_local;
  size_t unfiltered_max_local;
  size_t simple_size_local;
  _func_size_t_lzma_simple_ptr_uint32_t__Bool_uint8_t_ptr_size_t *filter_local;
  lzma_filter_info *filters_local;
  lzma_allocator *allocator_local;
  lzma_next_coder_conflict9 *next_local;
  
  if (next->coder == (lzma_coder_conflict10 *)0x0) {
    plVar2 = (lzma_coder_conflict10 *)lzma_alloc(unfiltered_max * 2 + 0x80,allocator);
    next->coder = plVar2;
    if (next->coder == (lzma_coder_conflict10 *)0x0) {
      return LZMA_MEM_ERROR;
    }
    next->code = simple_code;
    next->end = simple_coder_end;
    next->update = simple_coder_update;
    memcpy(next->coder,&LZMA_NEXT_CODER_INIT,0x40);
    next->coder->filter = filter;
    next->coder->allocated = unfiltered_max << 1;
    if (simple_size == 0) {
      next->coder->simple = (lzma_simple *)0x0;
    }
    else {
      plVar3 = (lzma_simple *)lzma_alloc(simple_size,allocator);
      next->coder->simple = plVar3;
      if (next->coder->simple == (lzma_simple *)0x0) {
        return LZMA_MEM_ERROR;
      }
    }
  }
  if (filters->options == (void *)0x0) {
    next->coder->now_pos = 0;
  }
  else {
    next->coder->now_pos = *filters->options;
    if ((next->coder->now_pos & alignment - 1) != 0) {
      return LZMA_OPTIONS_ERROR;
    }
  }
  next->coder->is_encoder = is_encoder;
  next->coder->end_was_reached = false;
  next->coder->pos = 0;
  next->coder->filtered = 0;
  next->coder->size = 0;
  lVar1 = lzma_next_filter_init((lzma_next_coder *)next->coder,allocator,filters + 1);
  return lVar1;
}

Assistant:

extern lzma_ret
lzma_simple_coder_init(lzma_next_coder *next, lzma_allocator *allocator,
		const lzma_filter_info *filters,
		size_t (*filter)(lzma_simple *simple, uint32_t now_pos,
			bool is_encoder, uint8_t *buffer, size_t size),
		size_t simple_size, size_t unfiltered_max,
		uint32_t alignment, bool is_encoder)
{
	// Allocate memory for the lzma_coder structure if needed.
	if (next->coder == NULL) {
		// Here we allocate space also for the temporary buffer. We
		// need twice the size of unfiltered_max, because then it
		// is always possible to filter at least unfiltered_max bytes
		// more data in coder->buffer[] if it can be filled completely.
		next->coder = lzma_alloc(sizeof(lzma_coder)
				+ 2 * unfiltered_max, allocator);
		if (next->coder == NULL)
			return LZMA_MEM_ERROR;

		next->code = &simple_code;
		next->end = &simple_coder_end;
		next->update = &simple_coder_update;

		next->coder->next = LZMA_NEXT_CODER_INIT;
		next->coder->filter = filter;
		next->coder->allocated = 2 * unfiltered_max;

		// Allocate memory for filter-specific data structure.
		if (simple_size > 0) {
			next->coder->simple = lzma_alloc(
					simple_size, allocator);
			if (next->coder->simple == NULL)
				return LZMA_MEM_ERROR;
		} else {
			next->coder->simple = NULL;
		}
	}

	if (filters[0].options != NULL) {
		const lzma_options_bcj *simple = filters[0].options;
		next->coder->now_pos = simple->start_offset;
		if (next->coder->now_pos & (alignment - 1))
			return LZMA_OPTIONS_ERROR;
	} else {
		next->coder->now_pos = 0;
	}

	// Reset variables.
	next->coder->is_encoder = is_encoder;
	next->coder->end_was_reached = false;
	next->coder->pos = 0;
	next->coder->filtered = 0;
	next->coder->size = 0;

	return lzma_next_filter_init(
			&next->coder->next, allocator, filters + 1);
}